

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcols.c
# Opt level: O1

int ffpcls(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
          char **array,int *status)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  LONGLONG nelem_00;
  long lVar7;
  long ngroups;
  long twidth;
  int maxelem;
  LONGLONG elemnum;
  int tcode;
  fitsfile *local_71a0;
  LONGLONG repeat;
  long incre;
  LONGLONG startpos;
  int hdutype;
  LONGLONG rowlen;
  double zero;
  double scale;
  LONGLONG tnull;
  char snull [20];
  char tform [20];
  char message [81];
  double cbuff [3600];
  
  iVar2 = *status;
  if (iVar2 < 1) {
    if (fptr->HDUposition == fptr->Fptr->curhdu) {
      if ((fptr->Fptr->datastart == -1) &&
         (local_71a0 = fptr, iVar2 = ffrdef(fptr,status), fptr = local_71a0, 0 < iVar2)) {
        return *status;
      }
    }
    else {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if ((colnum < 1) || (fptr->Fptr->tfield < colnum)) {
      snprintf(message,0x51,"Specified column number is out of range: %d",(ulong)(uint)colnum);
      ffpmsg(message);
      *status = 0x12e;
      iVar2 = 0x12e;
    }
    else {
      tcode = fptr->Fptr->tableptr[(ulong)(uint)colnum - 1].tdatatype;
      if (tcode == 0x10) {
        iVar2 = ffgcprll(fptr,colnum,firstrow,firstelem,nelem,1,&scale,&zero,tform,&twidth,&tcode,
                         &maxelem,&startpos,&elemnum,&incre,&repeat,&rowlen,&hdutype,&tnull,snull,
                         status);
        if (iVar2 < 1) {
          if (0xb40 < twidth) {
            maxelem = 1;
            incre = twidth;
            repeat = 1;
          }
          if (nelem != 0) {
            lVar7 = 0;
            local_71a0 = (fitsfile *)0x0;
            do {
              lVar4 = (long)maxelem;
              if (nelem < maxelem) {
                lVar4 = nelem;
              }
              ngroups = repeat - elemnum;
              if (lVar4 < repeat - elemnum) {
                ngroups = lVar4;
              }
              ffmbyt(fptr,elemnum * incre + rowlen * (long)local_71a0 + startpos,1,status);
              if (0 < ngroups) {
                lVar4 = lVar7 + ngroups;
                pdVar5 = cbuff;
                do {
                  if (twidth < 1) {
                    lVar6 = 0;
                  }
                  else {
                    pcVar1 = array[lVar7];
                    lVar6 = 0;
                    do {
                      if (pcVar1[lVar6] == '\0') break;
                      *(char *)((long)pdVar5 + lVar6) = pcVar1[lVar6];
                      lVar6 = lVar6 + 1;
                    } while (lVar6 < twidth);
                    pdVar5 = (double *)((long)pdVar5 + lVar6);
                  }
                  for (; lVar6 < twidth; lVar6 = lVar6 + 1) {
                    *(undefined1 *)pdVar5 = 0x20;
                    pdVar5 = (double *)((long)pdVar5 + 1);
                  }
                  lVar7 = lVar7 + 1;
                } while (lVar7 != lVar4);
              }
              if (incre - twidth == 0) {
                ffpbyt(fptr,twidth * ngroups,cbuff,status);
              }
              else {
                ffpbytoff(fptr,twidth,ngroups,incre - twidth,cbuff,status);
              }
              if (0 < *status) {
                snprintf(message,0x51,
                         "Error writing elements %.0f thru %.0f of input data array (ffpcls).",
                         SUB84((double)(lVar7 + 1),0),(double)(ngroups + lVar7));
                ffpmsg(message);
                return *status;
              }
              nelem = nelem - ngroups;
              if ((nelem != 0) && (elemnum = ngroups + elemnum, elemnum == repeat)) {
                elemnum = 0;
                local_71a0 = (fitsfile *)((long)local_71a0 + 1);
              }
            } while (nelem != 0);
          }
          iVar2 = *status;
        }
        else {
          iVar2 = *status;
        }
      }
      else if (tcode == -0x10) {
        sVar3 = strlen(*array);
        nelem_00 = (LONGLONG)(int)sVar3;
        if (sVar3 == 0) {
          nelem_00 = 1;
        }
        iVar2 = ffgcprll(fptr,colnum,firstrow,1,nelem_00,1,&scale,&zero,tform,&twidth,&tcode,
                         &maxelem,&startpos,&elemnum,&incre,&repeat,&rowlen,&hdutype,&tnull,snull,
                         status);
        if (iVar2 < 1) {
          ffmbyt(fptr,startpos,1,status);
          ffpbyt(fptr,nelem_00,*array,status);
          if (0 < *status) {
            builtin_strncpy(message + 0x30,"ffpcls).",9);
            builtin_strncpy(message + 0x20," string column (",0x10);
            builtin_strncpy(message + 0x10," variable length",0x10);
            builtin_strncpy(message,"Error writing to",0x10);
            ffpmsg(message);
          }
        }
        iVar2 = *status;
      }
      else {
        *status = 0x135;
        iVar2 = 0x135;
      }
    }
  }
  return iVar2;
}

Assistant:

int ffpcls( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of strings to write              */
            char  **array,   /* I - array of pointers to strings            */
            int  *status)    /* IO - error status                           */
/*
  Write an array of string values to a column in the current FITS HDU.
*/
{
    int tcode, maxelem, hdutype, nchar;
    long twidth, incre;
    long ii, jj, ntodo;
    LONGLONG repeat, startpos, elemnum, wrtptr, rowlen, rownum, remain, next, tnull;
    double scale, zero;
    char tform[20], *blanks;
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value  */
    tcolumn *colptr;

    double cbuff[DBUFFSIZE / sizeof(double)]; /* align cbuff on word boundary */
    char *buffer, *arrayptr;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);
    }

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
    {
        snprintf(message, FLEN_ERRMSG,"Specified column number is out of range: %d",
                colnum);
        ffpmsg(message);
        return(*status = BAD_COL_NUM);
    }

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */
    tcode = colptr->tdatatype;

    if (tcode == -TSTRING) /* variable length column in a binary table? */
    {
      /* only write a single string; ignore value of firstelem */
      nchar = maxvalue(1,strlen(array[0])); /* will write at least 1 char */
                                          /* even if input string is null */

      if (ffgcprll( fptr, colnum, firstrow, 1, nchar, 1, &scale, &zero,
        tform, &twidth, &tcode, &maxelem, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);
	
      /* simply move to write position, then write the string */
      ffmbyt(fptr, startpos, IGNORE_EOF, status); 
      ffpbyt(fptr, nchar, array[0], status);

      if (*status > 0)  /* test for error during previous write operation */
      {
         snprintf(message,FLEN_ERRMSG,
          "Error writing to variable length string column (ffpcls).");
         ffpmsg(message);
      }

      return(*status);
    }
    else if (tcode == TSTRING)
    {
      if (ffgcprll( fptr, colnum, firstrow, firstelem, nelem, 1, &scale, &zero,
        tform, &twidth, &tcode, &maxelem, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);

      /* if string length is greater than a FITS block (2880 char) then must */
      /* only write 1 string at a time, to force writein by ffpbyt instead of */
      /* ffpbytoff (ffpbytoff can't handle this case) */
      if (twidth > IOBUFLEN) {
        maxelem = 1;
        incre = twidth;
        repeat = 1;
      }   

      blanks = (char *) malloc(twidth); /* string for blank fill values */
      if (!blanks)
      {
        ffpmsg("Could not allocate memory for string (ffpcls)");
        return(*status = ARRAY_TOO_BIG);
      }

      for (ii = 0; ii < twidth; ii++)
          blanks[ii] = ' ';          /* fill string with blanks */

      remain = nelem;           /* remaining number of values to write  */
    }
    else 
      return(*status = NOT_ASCII_COL);
 
    /*-------------------------------------------------------*/
    /*  Now write the strings to the FITS column.            */
    /*-------------------------------------------------------*/

    next = 0;                 /* next element in array to be written  */
    rownum = 0;               /* row number, relative to firstrow     */

    while (remain)
    {
      /* limit the number of pixels to process at one time to the number that
         will fit in the buffer space or to the number of pixels that remain
         in the current vector, which ever is smaller.
      */
      ntodo = (long) minvalue(remain, maxelem);      
      ntodo = (long) minvalue(ntodo, (repeat - elemnum));

      wrtptr = startpos + (rownum * rowlen) + (elemnum * incre);
      ffmbyt(fptr, wrtptr, IGNORE_EOF, status);  /* move to write position */

      buffer = (char *) cbuff;

      /* copy the user's strings into the buffer */
      for (ii = 0; ii < ntodo; ii++)
      {
         arrayptr = array[next];

         for (jj = 0; jj < twidth; jj++)  /*  copy the string, char by char */
         {
            if (*arrayptr)
            {
              *buffer = *arrayptr;
              buffer++;
              arrayptr++;
            }
            else
              break;
         }

         for (;jj < twidth; jj++)    /* fill field with blanks, if needed */
         {
           *buffer = ' ';
           buffer++;
         }

         next++;
      }

      /* write the buffer full of strings to the FITS file */
      if (incre == twidth)
         ffpbyt(fptr, ntodo * twidth, cbuff, status);
      else
         ffpbytoff(fptr, twidth, ntodo, incre - twidth, cbuff, status);

      if (*status > 0)  /* test for error during previous write operation */
      {
         snprintf(message,FLEN_ERRMSG,
          "Error writing elements %.0f thru %.0f of input data array (ffpcls).",
             (double) (next+1), (double) (next+ntodo));
         ffpmsg(message);

         if (blanks)
           free(blanks);

         return(*status);
      }

      /*--------------------------------------------*/
      /*  increment the counters for the next loop  */
      /*--------------------------------------------*/
      remain -= ntodo;
      if (remain)
      {
          elemnum += ntodo;
          if (elemnum == repeat)  /* completed a row; start on next row */
          {
              elemnum = 0;
              rownum++;
          }
       }
    }  /*  End of main while Loop  */

    if (blanks)
      free(blanks);

    return(*status);
}